

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O1

bool __thiscall
mapbox::detail::Earcut<unsigned_int>::isEarHashed(Earcut<unsigned_int> *this,Node *ear)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Node *pNVar10;
  Node *pNVar11;
  bool bVar12;
  int32_t iVar13;
  int32_t iVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double *pdVar19;
  double *pdVar20;
  double *pdVar21;
  
  pNVar10 = ear->prev;
  pNVar11 = ear->next;
  dVar4 = ear->x;
  dVar5 = ear->y;
  dVar6 = pNVar10->x;
  dVar7 = pNVar10->y;
  dVar8 = pNVar11->x;
  dVar9 = pNVar11->y;
  if (0.0 <= (dVar8 - dVar4) * (dVar5 - dVar7) - (dVar9 - dVar5) * (dVar4 - dVar6)) {
LAB_003b372f:
    bVar12 = false;
  }
  else {
    pdVar1 = &pNVar10->y;
    pdVar3 = &pNVar11->x;
    pdVar2 = &ear->x;
    pdVar21 = &pNVar10->x;
    pdVar20 = &pNVar11->y;
    pdVar15 = pdVar2;
    if (dVar8 < dVar4) {
      pdVar15 = pdVar3;
    }
    if (dVar6 < *pdVar15 || dVar6 == *pdVar15) {
      pdVar15 = pdVar21;
    }
    pdVar19 = &ear->y;
    pdVar17 = pdVar19;
    if (dVar9 < dVar5) {
      pdVar17 = pdVar20;
    }
    if (dVar7 < *pdVar17 || dVar7 == *pdVar17) {
      pdVar17 = pdVar1;
    }
    pdVar18 = pdVar2;
    if (dVar4 < dVar8) {
      pdVar18 = pdVar3;
    }
    if (*pdVar18 <= dVar6) {
      pdVar18 = pdVar21;
    }
    pdVar16 = pdVar19;
    if (dVar5 < dVar9) {
      pdVar16 = pdVar20;
    }
    dVar4 = *pdVar18;
    if (*pdVar16 <= dVar7) {
      pdVar16 = pdVar1;
    }
    dVar5 = *pdVar16;
    iVar13 = zOrder(this,*pdVar15,*pdVar17);
    iVar14 = zOrder(this,dVar4,dVar5);
    for (pNVar10 = ear->nextZ; (pNVar10 != (Node *)0x0 && (pNVar10->z <= iVar14));
        pNVar10 = pNVar10->nextZ) {
      if ((pNVar10 != ear->prev) && (pNVar10 != ear->next)) {
        dVar4 = pNVar10->x;
        dVar5 = pNVar10->y;
        if ((*pdVar21 - dVar4) * (*pdVar20 - dVar5) <= (*pdVar3 - dVar4) * (*pdVar1 - dVar5)) {
          if ((((*pdVar1 - dVar5) * (*pdVar2 - dVar4) <= (*pdVar21 - dVar4) * (*pdVar19 - dVar5)) &&
              ((*pdVar3 - dVar4) * (*pdVar19 - dVar5) <= (*pdVar20 - dVar5) * (*pdVar2 - dVar4))) &&
             (0.0 <= (pNVar10->next->x - dVar4) * (dVar5 - pNVar10->prev->y) -
                     (pNVar10->next->y - dVar5) * (dVar4 - pNVar10->prev->x))) goto LAB_003b372f;
        }
      }
    }
    bVar12 = true;
    for (pNVar10 = ear->prevZ; (pNVar10 != (Node *)0x0 && (iVar13 <= pNVar10->z));
        pNVar10 = pNVar10->prevZ) {
      if ((pNVar10 != ear->prev) && (pNVar10 != ear->next)) {
        dVar4 = pNVar10->x;
        dVar5 = pNVar10->y;
        if ((*pdVar21 - dVar4) * (*pdVar20 - dVar5) <= (*pdVar3 - dVar4) * (*pdVar1 - dVar5)) {
          if ((((*pdVar1 - dVar5) * (*pdVar2 - dVar4) <= (*pdVar21 - dVar4) * (*pdVar19 - dVar5)) &&
              ((*pdVar3 - dVar4) * (*pdVar19 - dVar5) <= (*pdVar20 - dVar5) * (*pdVar2 - dVar4))) &&
             (0.0 <= (pNVar10->next->x - dVar4) * (dVar5 - pNVar10->prev->y) -
                     (pNVar10->next->y - dVar5) * (dVar4 - pNVar10->prev->x))) goto LAB_003b372f;
        }
      }
    }
  }
  return bVar12;
}

Assistant:

bool Earcut<N>::isEarHashed(Node* ear) {
    const Node* a = ear->prev;
    const Node* b = ear;
    const Node* c = ear->next;

    if (area(a, b, c) >= 0) return false; // reflex, can't be an ear

    // triangle bbox; min & max are calculated like this for speed
    const double minTX = std::min<double>(a->x, std::min<double>(b->x, c->x));
    const double minTY = std::min<double>(a->y, std::min<double>(b->y, c->y));
    const double maxTX = std::max<double>(a->x, std::max<double>(b->x, c->x));
    const double maxTY = std::max<double>(a->y, std::max<double>(b->y, c->y));

    // z-order range for the current triangle bbox;
    const int32_t minZ = zOrder(minTX, minTY);
    const int32_t maxZ = zOrder(maxTX, maxTY);

    // first look for points inside the triangle in increasing z-order
    Node* p = ear->nextZ;

    while (p && p->z <= maxZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->nextZ;
    }

    // then look for points in decreasing z-order
    p = ear->prevZ;

    while (p && p->z >= minZ) {
        if (p != ear->prev && p != ear->next &&
            pointInTriangle(a->x, a->y, b->x, b->y, c->x, c->y, p->x, p->y) &&
            area(p->prev, p, p->next) >= 0) return false;
        p = p->prevZ;
    }

    return true;
}